

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O2

void * assetsys_internal_mz_realloc(void *memctx,void *ptr,size_t items,size_t size)

{
  ulong __n;
  ulong *puVar1;
  void *pvVar2;
  ulong uVar3;
  
  if (ptr != (void *)0x0) {
    __n = *(ulong *)((long)ptr + -8);
    uVar3 = size * items;
    puVar1 = (ulong *)ptr;
    if (__n < uVar3) {
      puVar1 = (ulong *)malloc(uVar3 + 8);
      *puVar1 = uVar3;
      puVar1 = puVar1 + 1;
      memcpy(puVar1,ptr,__n);
      free((void *)((long)ptr + -8));
    }
    return puVar1;
  }
  pvVar2 = assetsys_internal_mz_alloc(memctx,items,size);
  return pvVar2;
}

Assistant:

static void* assetsys_internal_mz_realloc( void* memctx, void* ptr, size_t items, size_t size ) 
    { 
    (void) memctx; (void) ptr; (void) items; (void) size; 
    if( !ptr ) return assetsys_internal_mz_alloc( memctx, items, size );
   
    ASSETSYS_U64* p = ( (ASSETSYS_U64*) ptr ) - 1;
    ASSETSYS_U64 prev_size = *p;
    if( prev_size >= ( items * size ) ) return ptr;
    
    ASSETSYS_U64* new_ptr = (ASSETSYS_U64*) ASSETSYS_MALLOC( memctx, ( items * size ) + sizeof( ASSETSYS_U64 ) ); 
    *new_ptr = ( items * size );
    ++new_ptr;
    memcpy( new_ptr, ptr, (size_t) prev_size );
    ASSETSYS_FREE( memctx, p );
    return new_ptr;
    }